

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

int define_kf_interval(AV1_COMP *cpi,FIRSTPASS_INFO *firstpass_info,
                      int num_frames_to_detect_scenecut,int search_start_idx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  aom_rc_mode aVar4;
  AV1_PRIMARY *pAVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  FIRSTPASS_INFO *firstpass_info_00;
  FIRSTPASS_STATS *pFVar13;
  FIRSTPASS_STATS *pFVar14;
  FIRSTPASS_STATS *pFVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint frame_interval;
  uint uVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double recent_loop_decay [8];
  int local_ec;
  double adStack_78 [9];
  
  pAVar5 = cpi->ppi;
  iVar10 = (cpi->rc).frames_since_key;
  iVar7 = is_forced_keyframe_pending
                    (pAVar5->lookahead,pAVar5->lookahead->max_sz,cpi->compressor_stage);
  if (num_frames_to_detect_scenecut == 0) {
    if (iVar7 == -1) {
      iVar7 = (cpi->rc).frames_to_key;
    }
  }
  else {
    iVar16 = num_frames_to_detect_scenecut;
    if (iVar7 < num_frames_to_detect_scenecut) {
      iVar16 = iVar7;
    }
    lVar11 = 0;
    do {
      adStack_78[lVar11] = 1.0;
      adStack_78[lVar11 + 1] = 1.0;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 8);
    if (iVar7 == -1) {
      iVar16 = num_frames_to_detect_scenecut;
    }
    piVar12 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar12 = &(cpi->common).mi_params.MBs;
    }
    iVar2 = *piVar12;
    frame_interval = 0;
    iVar8 = av1_firstpass_info_future_count(firstpass_info,0);
    if (iVar8 < iVar16) {
      iVar16 = iVar8;
    }
    if (search_start_idx < iVar16) {
      firstpass_info_00 = &(pAVar5->twopass).firstpass_info;
      do {
        iVar1 = iVar10 + 1;
        iVar3 = (cpi->ppi->p_rc).enable_scenecut_detection;
        if (((0 < iVar3) && ((cpi->oxcf).kf_cfg.auto_key == true)) && (search_start_idx + 1 < iVar8)
           ) {
          if (iVar1 < (cpi->oxcf).kf_cfg.key_freq_min) {
LAB_001fa800:
            local_ec = search_start_idx + 1;
            pFVar13 = av1_firstpass_info_peek(firstpass_info,local_ec);
            dVar24 = get_prediction_decay_rate(pFVar13);
            adStack_78[frame_interval & 7] = dVar24;
            lVar11 = 0;
            dVar23 = 1.0;
            do {
              dVar23 = dVar23 * adStack_78[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 8);
            if ((iVar1 < (cpi->oxcf).kf_cfg.key_freq_min) ||
               (iVar10 = detect_transition_to_still
                                   (firstpass_info,local_ec,(cpi->rc).min_gf_interval,frame_interval
                                    ,(cpi->oxcf).kf_cfg.key_freq_max - frame_interval,dVar24,dVar23)
               , iVar10 == 0)) {
              if (local_ec < (cpi->oxcf).kf_cfg.key_freq_max * 2) goto LAB_001fa4bc;
              frame_interval = 0;
              search_start_idx = local_ec;
              goto LAB_001fa8a2;
            }
            (pAVar5->p_rc).use_arf_in_this_kf_group = 0;
          }
          else {
            aVar4 = (cpi->oxcf).rc_cfg.mode;
            pFVar13 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + -1);
            pFVar14 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx);
            pFVar15 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + 1);
            if (pFVar15 == (FIRSTPASS_STATS *)0x0 ||
                (pFVar14 == (FIRSTPASS_STATS *)0x0 || pFVar13 == (FIRSTPASS_STATS *)0x0))
            goto LAB_001fa800;
            dVar24 = 0.12000000000000001;
            if (iVar10 < 0x1f) {
              dVar24 = ((double)iVar1 / 31.0) * 0.035 + 0.085;
            }
            dVar23 = pFVar14->pcnt_inter;
            dVar25 = dVar23 - pFVar14->pcnt_neutral;
            iVar9 = av1_firstpass_info_future_count(firstpass_info_00,search_start_idx);
            if (iVar3 == 1) {
              if (iVar9 < 4) goto LAB_001fa800;
              uVar19 = 1;
              uVar17 = 3;
            }
            else {
              uVar19 = 3;
              uVar17 = 0x10;
            }
            uVar20 = iVar9 - 1U;
            if ((int)uVar17 < (int)(iVar9 - 1U)) {
              uVar20 = uVar17;
            }
            if (((iVar10 < 2) && (aVar4 == AOM_Q)) ||
               ((dVar24 < pFVar14->pcnt_second_ref || dVar24 == pFVar14->pcnt_second_ref ||
                (dVar24 < pFVar15->pcnt_second_ref || dVar24 == pFVar15->pcnt_second_ref))))
            goto LAB_001fa800;
            if (0.05 < pFVar14->pcnt_inter || pFVar14->pcnt_inter == 0.05) {
              dVar24 = pFVar14->intra_error;
              dVar22 = pFVar14->coded_error;
              if (((dVar24 < dVar22 * 1.5) && (pFVar13->coded_error * 5.0 < dVar22)) &&
                 (pFVar15->coded_error * 5.0 < dVar22)) goto LAB_001fa52f;
              dVar23 = 1.0 - dVar23;
              if (((dVar23 <= 0.25) || (dVar23 <= dVar25 + dVar25)) ||
                 (1.9 <= dVar24 / (*(double *)(&DAT_004e08f0 + (ulong)(dVar22 < 0.0) * 8) + dVar22))
                 ) goto LAB_001fa800;
              if ((0.4 < ABS(pFVar13->coded_error - dVar22) /
                         (*(double *)(&DAT_004e08f0 + (ulong)(dVar22 < 0.0) * 8) + dVar22)) ||
                 (0.4 < ABS(pFVar13->intra_error - dVar24) /
                        (dVar24 + *(double *)(&DAT_004e08f0 + (ulong)(dVar24 < 0.0) * 8))))
              goto LAB_001fa52f;
              if (iVar9 < 2 ||
                  pFVar15->intra_error /
                  (pFVar15->coded_error +
                  *(double *)(&DAT_004e08f0 + (ulong)(pFVar15->coded_error < 0.0) * 8)) <= 3.5)
              goto LAB_001fa800;
            }
            else {
LAB_001fa52f:
              if (iVar9 < 2) goto LAB_001fa800;
            }
            dVar23 = 1.0;
            dVar24 = 0.0;
            uVar17 = 1;
            do {
              pFVar13 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + uVar17);
              dVar22 = (pFVar13->intra_error * 12.5) /
                       (pFVar13->coded_error +
                       *(double *)(&DAT_004e08f0 + (ulong)(pFVar13->coded_error < 0.0) * 8));
              dVar25 = 128.0;
              if (dVar22 <= 128.0) {
                dVar25 = dVar22;
              }
              dVar22 = pFVar13->pcnt_inter;
              dVar23 = (double)(~-(ulong)(0.85 < dVar22) & (ulong)((dVar22 + 0.85) * 0.5) |
                               -(ulong)(0.85 < dVar22) & (ulong)dVar22) * dVar23;
              dVar6 = dVar23 * dVar25 + dVar24;
              uVar18 = uVar17;
            } while (((0.05 <= dVar22) && (1.5 <= dVar25)) &&
                    ((200.0 / (double)iVar2 <= pFVar13->intra_error &&
                     (((3.0 <= dVar25 || 0.2 <= dVar22 - pFVar13->pcnt_neutral &&
                       (3.0 <= dVar6 - dVar24)) &&
                      (bVar21 = uVar17 != uVar20, dVar24 = dVar6, uVar17 = uVar17 + 1,
                      uVar18 = uVar20 + 1, bVar21))))));
            if ((dVar6 <= 30.0) || (uVar18 <= uVar19)) goto LAB_001fa800;
          }
          frame_interval = 1;
          goto LAB_001fa8a2;
        }
LAB_001fa4bc:
        search_start_idx = search_start_idx + 1;
        frame_interval = frame_interval + 1;
        iVar10 = iVar1;
      } while (search_start_idx < iVar16);
      frame_interval = 0;
    }
LAB_001fa8a2:
    if (cpi->ppi->lap_enabled == 0) {
      iVar7 = search_start_idx;
    }
    if ((char)frame_interval != '\0') {
      iVar7 = search_start_idx;
    }
  }
  return iVar7;
}

Assistant:

static int define_kf_interval(AV1_COMP *cpi,
                              const FIRSTPASS_INFO *firstpass_info,
                              int num_frames_to_detect_scenecut,
                              int search_start_idx) {
  const TWO_PASS *const twopass = &cpi->ppi->twopass;
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const KeyFrameCfg *const kf_cfg = &oxcf->kf_cfg;
  double recent_loop_decay[FRAMES_TO_CHECK_DECAY];
  double decay_accumulator = 1.0;
  int i = 0, j;
  int frames_to_key = search_start_idx;
  int frames_since_key = rc->frames_since_key + 1;
  int scenecut_detected = 0;

  int num_frames_to_next_key = detect_app_forced_key(cpi);

  if (num_frames_to_detect_scenecut == 0) {
    if (num_frames_to_next_key != -1)
      return num_frames_to_next_key;
    else
      return rc->frames_to_key;
  }

  if (num_frames_to_next_key != -1)
    num_frames_to_detect_scenecut =
        AOMMIN(num_frames_to_detect_scenecut, num_frames_to_next_key);

  // Initialize the decay rates for the recent frames to check
  for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j) recent_loop_decay[j] = 1.0;

  i = 0;
  const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                          ? cpi->initial_mbs
                          : cpi->common.mi_params.MBs;
  const int future_stats_count =
      av1_firstpass_info_future_count(firstpass_info, 0);
  while (frames_to_key < future_stats_count &&
         frames_to_key < num_frames_to_detect_scenecut) {
    // Provided that we are not at the end of the file...
    if ((cpi->ppi->p_rc.enable_scenecut_detection > 0) && kf_cfg->auto_key &&
        frames_to_key + 1 < future_stats_count) {
      double loop_decay_rate;

      // Check for a scene cut.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = test_candidate_kf(
            &twopass->firstpass_info, frames_to_key, frames_since_key,
            oxcf->rc_cfg.mode, cpi->ppi->p_rc.enable_scenecut_detection,
            num_mbs);
        if (scenecut_detected) {
          break;
        }
      }

      // How fast is the prediction quality decaying?
      const FIRSTPASS_STATS *next_stats =
          av1_firstpass_info_peek(firstpass_info, frames_to_key + 1);
      loop_decay_rate = get_prediction_decay_rate(next_stats);

      // We want to know something about the recent past... rather than
      // as used elsewhere where we are concerned with decay in prediction
      // quality since the last GF or KF.
      recent_loop_decay[i % FRAMES_TO_CHECK_DECAY] = loop_decay_rate;
      decay_accumulator = 1.0;
      for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j)
        decay_accumulator *= recent_loop_decay[j];

      // Special check for transition or high motion followed by a
      // static scene.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = detect_transition_to_still(
            firstpass_info, frames_to_key + 1, rc->min_gf_interval, i,
            kf_cfg->key_freq_max - i, loop_decay_rate, decay_accumulator);
        if (scenecut_detected) {
          // In the case of transition followed by a static scene, the key frame
          // could be a good predictor for the following frames, therefore we
          // do not use an arf.
          p_rc->use_arf_in_this_kf_group = 0;
          break;
        }
      }

      // Step on to the next frame.
      ++frames_to_key;
      ++frames_since_key;

      // If we don't have a real key frame within the next two
      // key_freq_max intervals then break out of the loop.
      if (frames_to_key >= 2 * kf_cfg->key_freq_max) {
        break;
      }
    } else {
      ++frames_to_key;
      ++frames_since_key;
    }
    ++i;
  }
  if (cpi->ppi->lap_enabled && !scenecut_detected)
    frames_to_key = num_frames_to_next_key;

  return frames_to_key;
}